

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::invalidate(HEkk *this)

{
  (this->status_).initialised_for_new_lp = false;
  (this->status_).initialised_for_solve = false;
  invalidateBasisMatrix(this);
  (this->simplex_stats_).valid = false;
  (this->simplex_stats_).col_aq_density = 0.0;
  (this->simplex_stats_).row_ep_density = 0.0;
  (this->simplex_stats_).row_ap_density = 0.0;
  (this->simplex_stats_).row_DSE_density = 0.0;
  (this->simplex_stats_).iteration_count = 0;
  (this->simplex_stats_).num_invert = 0;
  (this->simplex_stats_).last_invert_num_el = 0;
  (this->simplex_stats_).last_factored_basis_num_el = 0;
  return;
}

Assistant:

void HEkk::invalidate() {
  this->status_.initialised_for_new_lp = false;
  assert(!this->status_.is_dualized);
  assert(!this->status_.is_permuted);
  this->status_.initialised_for_solve = false;
  this->invalidateBasisMatrix();
  this->simplex_stats_.initialise();
}